

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int f_close(lua_State *L)

{
  int iVar1;
  
  tofile(L);
  iVar1 = aux_close(L);
  return iVar1;
}

Assistant:

static int f_close (lua_State *L) {
  tofile(L);  /* make sure argument is an open stream */
  return aux_close(L);
}